

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzquad.cpp
# Opt level: O2

void __thiscall TPZIntTetra3D::Point(TPZIntTetra3D *this,int ip,TPZVec<double> *pos,REAL *w)

{
  int iVar1;
  ostream *poVar2;
  TPZIntRuleT3D *this_00;
  REAL RVar3;
  
  this_00 = this->fIntKsi;
  if (-1 < ip && this_00 != (TPZIntRuleT3D *)0x0) {
    iVar1 = (*(this->super_TPZIntPoints)._vptr_TPZIntPoints[3])(this);
    this_00 = this->fIntKsi;
    if (ip < iVar1) {
      TPZIntRuleT3D::Loc(this_00,ip,pos);
      RVar3 = TPZIntRuleT3D::W(this->fIntKsi,ip);
      *w = RVar3;
      return;
    }
  }
  if (this_00 == (TPZIntRuleT3D *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Null Pointer passed to method ");
    std::operator<<(poVar2,"TPZIntTetra3D::Point(..)\n");
  }
  if ((-1 < ip) && (iVar1 = (*(this->super_TPZIntPoints)._vptr_TPZIntPoints[3])(this), ip < iVar1))
  {
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"ip = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,ip);
  poVar2 = std::operator<<(poVar2,", Out of Range: 0 -> ");
  iVar1 = (*(this->super_TPZIntPoints)._vptr_TPZIntPoints[3])(this);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void TPZIntTetra3D::Point(int ip, TPZVec<REAL> &pos, REAL &w) const {
	if((fIntKsi) && ((ip >= 0) && (ip < NPoints()))) {
		fIntKsi->Loc(ip, pos);
		w = fIntKsi->W(ip);
		return;
	}
	if(!fIntKsi)
		PZError 	<< "Null Pointer passed to method " << "TPZIntTetra3D::Point(..)\n";
	if((ip < 0) || (ip >= NPoints()))
		PZError 	<< "ip = " << ip << ", Out of Range: 0 -> " << NPoints() << std::endl;
}